

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::UnaryExpr<const_int_&>::streamReconstructedExpression
          (UnaryExpr<const_int_&> *this,ostream *os)

{
  string local_30;
  
  Detail::stringify<int>(&local_30,this->m_lhs);
  std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }